

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmObjBigNum::wp8s(CVmObjBigNum *this,char *buf,int *ov)

{
  int iVar1;
  uint *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  char *in_stack_00000008;
  int neg;
  
  iVar1 = get_neg(*(char **)(in_RDI + 8));
  wp8abs((CVmObjBigNum *)ov,in_stack_00000008,unaff_retaddr);
  if (iVar1 == 0) {
    *in_RDX = (int)(char)in_RSI[7] & 0x80U | *in_RDX;
  }
  else {
    twos_complement_p8(in_RSI);
    *in_RDX = (uint)(((int)(char)in_RSI[7] & 0x80U) == 0) | *in_RDX;
  }
  return;
}

Assistant:

void CVmObjBigNum::wp8s(char *buf, int &ov) const
{
    /* note if the value is negative */
    int neg = get_neg(ext_);

    /* generate the absolute value */
    wp8abs(buf, ov);

    /* if it's negative, compute the 2's complement of the buffer */
    if (neg)
    {
        /* take the 2's complement */
        twos_complement_p8((unsigned char *)buf);

        /* if it didn't come out negative, we have an overflow */
        ov |= ((buf[7] & 0x80) == 0);
    }
    else
    {
        /* positive - the sign bit is set, we overflowed */
        ov |= (buf[7] & 0x80);
    }
}